

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test *this)

{
  iuCodeMessage *this_00;
  int *in_R9;
  bool local_269;
  iuCodeMessage local_268;
  AssertionResult iutest_ar;
  undefined1 local_210 [40];
  wchar_t negative_sample [5];
  unsigned_long local_1d0 [2];
  undefined1 local_1c0 [40];
  Fixed local_198;
  
  negative_sample[4] = L'\0';
  negative_sample[0] = L'a';
  negative_sample[1] = L'a';
  negative_sample[2] = L'a';
  negative_sample[3] = L'\xffffffff';
  local_1d0[1] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::ExpressionLHS
            ((ExpressionLHS<unsigned_long> *)local_1c0,local_1d0 + 1);
  local_1d0[0] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::operator>=
            ((ExpressionResult *)local_210,(ExpressionLHS<unsigned_long> *)local_1c0,local_1d0);
  local_269 = true;
  iutest::detail::ExpressionResult::operator&&
            ((ExpressionResult *)&local_268,(ExpressionResult *)local_210,&local_269);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_268,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)))"
               ,"false","true",(char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x5a,(char *)local_210._0_8_);
    local_268._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,&local_198);
    std::__cxx11::string::~string((string *)&local_268);
    this_00 = (iuCodeMessage *)local_210;
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    local_268.m_message._M_dataplus._M_p._0_4_ =
         iutest::detail::wrapper::iu_wcsicmp(L"AAA",negative_sample);
    iutest::internal::CmpHelperLT<int,int>
              (&iutest_ar,(internal *)0x169a26,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)",(char *)&local_198
               ,(int *)&local_268,in_R9);
    if (iutest_ar.m_result != false) goto LAB_0015620c;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x5b,iutest_ar.m_message._M_dataplus._M_p);
    local_268._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,&local_198);
    this_00 = &local_268;
  }
  std::__cxx11::string::~string((string *)this_00);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_0015620c:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeLT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}